

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O3

void __thiscall QHostInfoResult::postResultsReady(QHostInfoResult *this,QHostInfo *info)

{
  Data *pDVar1;
  QHostInfoResult *this_00;
  long in_FS_OFFSET;
  code *local_48;
  undefined8 local_40;
  QMetaMethodReturnArgument local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->slotObj)._M_t.
      super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>._M_t.
      super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
      super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl ==
      (QSlotObjectBase *)0x0) {
    local_38.metaType = (QMetaTypeInterface *)0x0;
    local_38.name = (char *)info;
    QMetaObject::activate(&this->super_QObject,&staticMetaObject,0,&local_38.metaType);
  }
  else {
    pDVar1 = (this->receiver).wp.d;
    if (((pDVar1 != (Data *)0x0) &&
        ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i != 0)) &&
       ((this->receiver).wp.value != (QObject *)0x0)) {
      this_00 = (QHostInfoResult *)operator_new(0x28);
      QHostInfoResult(this_00,this);
      local_48 = finalizePostResultsReady;
      local_40 = 0;
      local_38.metaType = &QtPrivate::QMetaTypeInterfaceWrapper<void>::metaType;
      local_38.name = (char *)0x0;
      local_38.data = (void *)0x0;
      QMetaObject::
      invokeMethodCallableHelper<void(QHostInfoResult::*)(QHostInfo_const&),QHostInfo_const&>
                (this_00,(offset_in_QHostInfoResult_to_subr *)&local_48,QueuedConnection,&local_38,
                 info);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHostInfoResult::postResultsReady(const QHostInfo &info)
{
    // queued connection will take care of dispatching to right thread
    if (!slotObj) {
        emit resultsReady(info);
        return;
    }
    // we used to have a context object, but it's already destroyed
    if (!receiver)
        return;

    // a long-living version of this
    auto result = new QHostInfoResult(this);
    Q_CHECK_PTR(result);

    QMetaObject::invokeMethod(result,
                              &QHostInfoResult::finalizePostResultsReady,
                              Qt::QueuedConnection,
                              info);
}